

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

uint cio_write(opj_cio_t *cio,unsigned_long_long v,int n)

{
  opj_bool oVar1;
  uint in_EDX;
  int i;
  opj_cio_t *in_stack_ffffffffffffffd8;
  int local_20;
  
  local_20 = in_EDX - 1;
  while( true ) {
    if (local_20 < 0) {
      return in_EDX;
    }
    oVar1 = cio_byteout(in_stack_ffffffffffffffd8,'\0');
    if (oVar1 == 0) break;
    local_20 = local_20 + -1;
  }
  return 0;
}

Assistant:

unsigned int cio_write(opj_cio_t *cio, unsigned long long int v, int n) {
	int i;
	for (i = n - 1; i >= 0; i--) {
		if( !cio_byteout(cio, (unsigned char) ((v >> (i << 3)) & 0xff)) )
			return 0;
	}
	return n;
}